

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase358::run(TestCase358 *this)

{
  char *pcVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined3 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined3 uVar14;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StructSchema schema;
  Builder root;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_2;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_1;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 local_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 uStack_8a0;
  undefined4 local_89c;
  undefined8 uStack_898;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition;
  undefined4 uStack_704;
  undefined4 uStack_700;
  undefined4 local_6fc;
  uint local_5a8;
  int iStack_5a4;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined7 local_588;
  undefined1 uStack_581;
  undefined7 uStack_580;
  undefined1 uStack_579;
  undefined4 local_578;
  undefined3 uStack_574;
  Reader local_418;
  Reader local_3d0;
  Reader local_398;
  Reader local_360;
  Reader local_328;
  Builder local_2f0;
  Builder local_2b0;
  Builder local_270;
  Builder local_230;
  Reader local_1f0;
  Reader local_1a8;
  Reader local_160;
  MallocMessageBuilder builder;
  
  uVar13 = local_6fc;
  uVar12 = uStack_700;
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  schema.super_Schema.raw = (Schema)((long)schemas::s_9e2e784c915329b6 + 0x48);
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            (&root,&builder.super_MessageBuilder,(StructSchema)0x655668);
  name.content.size_ = 4;
  name.content.ptr = "foo";
  StructSchema::getFieldByName((Field *)&_kjCondition_1,&schema,name);
  iVar2 = (int)_kjCondition_1.op.content.ptr;
  pcVar1 = (char *)CONCAT44(_kjCondition_1.right,_kjCondition_1.left);
  uStack_5a0 = CONCAT44(_kjCondition_1._24_4_,_kjCondition_1.op.content.size_._4_4_);
  local_598 = CONCAT44(uStack_8b8,_kjCondition_1._28_4_);
  uStack_590 = CONCAT44(uStack_8b0,uStack_8b4);
  local_588 = (undefined7)CONCAT44(uStack_8a8,local_8ac);
  uStack_581 = (undefined1)((uint)uStack_8a8 >> 0x18);
  uVar5 = uStack_581;
  uStack_580 = (undefined7)CONCAT44(uStack_8a0,uStack_8a4);
  uStack_579 = (undefined1)((uint)uStack_8a0 >> 0x18);
  uVar8 = uStack_579;
  local_578 = local_89c;
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&root);
  uVar14 = uStack_574;
  uVar9 = uStack_579;
  uVar6 = uStack_581;
  if ((char)_kjCondition.left != '\x01') {
    kj::_::Debug::Fault::Fault
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16b,FAILED,"root.which() != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
  }
  _kjCondition_2.left.ptr.field_1._0_4_ = iVar2;
  _kjCondition_2.left.ptr.field_1._36_8_ = CONCAT17(uStack_581,local_588);
  _kjCondition_2.left.ptr.field_1._44_8_ = CONCAT17(uStack_579,uStack_580);
  _kjCondition_2.left.ptr.field_1._12_8_ = uStack_5a0;
  _kjCondition_2.left.ptr.field_1._20_8_ = local_598;
  _kjCondition_2.left.ptr.field_1._28_8_ = uStack_590;
  _kjCondition_2.left.ptr.field_1.value.description.content.size_._4_4_ = local_578;
  _kjCondition_2.left.ptr.field_1.value.description.content.disposer =
       (ArrayDisposer *)_kjCondition.op.content.ptr;
  _kjCondition_2.left.ptr.field_1._64_4_ = (int)_kjCondition.op.content.size_;
  _kjCondition_2.left.ptr.field_1.value.trace[2] = anon_var_dwarf_3d166;
  _kjCondition_2.left.ptr.field_1.value.trace[3] = &DAT_00000005;
  _kjCondition_2.left.ptr.field_1._136_1_ =
       iVar2 == (int)_kjCondition.op.content.size_ && pcVar1 == _kjCondition.op.content.ptr;
  uStack_579 = (undefined1)uStack_8a8;
  uVar10 = uStack_579;
  uStack_581 = (undefined1)uStack_8b0;
  uVar7 = uStack_581;
  uStack_574 = (undefined3)((uint)uStack_8a4 >> 8);
  uVar11 = uStack_574;
  uStack_700 = (undefined4)uStack_898;
  uVar3 = uStack_700;
  local_6fc = (undefined4)((ulong)uStack_898 >> 0x20);
  uVar4 = local_6fc;
  _kjCondition_2.left.ptr._0_8_ = pcVar1;
  uStack_581 = uVar6;
  uStack_579 = uVar9;
  if ((iVar2 != (int)_kjCondition.op.content.size_ || pcVar1 != _kjCondition.op.content.ptr) &&
     (kj::_::Debug::minSeverity < 3)) {
    name_00.content.size_ = 4;
    name_00.content.ptr = "foo";
    StructSchema::getFieldByName((Field *)&local_418,&schema,name_00);
    DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&_kjCondition_1,&root);
    if ((char)_kjCondition_1.left != '\x01') {
      kj::_::Debug::Fault::Fault
                ((Fault *)&_kjCondition_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x16b,FAILED,"root.which() != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
    }
    _kjCondition.op.content.ptr =
         (char *)CONCAT44(_kjCondition_1.op.content.ptr._4_4_,(int)_kjCondition_1.op.content.ptr);
    uStack_580 = (undefined7)(CONCAT44(local_8ac,uStack_8b0) >> 8);
    local_578 = (undefined4)(CONCAT44(uStack_8a4,uStack_8a8) >> 8);
    _kjCondition.left = CONCAT31(_kjCondition.left._1_3_,1);
    _kjCondition.op.content.size_._0_4_ = (int)_kjCondition_1.op.content.size_;
    _kjCondition.result = _kjCondition_1.result;
    _kjCondition._25_3_ = _kjCondition_1._25_3_;
    uStack_704 = local_89c;
    uStack_581 = uVar7;
    uStack_579 = uVar10;
    kj::_::Debug::
    log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16b,ERROR,
               "\"failed: expected \" \"(schema.getFieldByName(\\\"foo\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 363, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"foo\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 363, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [387])
                "failed: expected (schema.getFieldByName(\"foo\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 363, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                &_kjCondition_2,(Field *)&local_418,(Field *)&_kjCondition.op);
    uVar12 = uStack_700;
    uVar13 = local_6fc;
    uVar14 = uStack_574;
  }
  uStack_574 = uVar14;
  local_6fc = uVar13;
  uStack_700 = uVar12;
  _kjCondition_2.left.ptr._0_4_ = 3;
  _kjCondition_2.left.ptr.field_1._0_4_ = 0x141;
  _kjCondition_2.left.ptr.field_1._4_4_ = 0;
  name_33.content.size_ = 4;
  name_33.content.ptr = "bar";
  DynamicStruct::Builder::set(&root,name_33,(Reader *)&_kjCondition_2);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
  name_01.content.size_ = 4;
  name_01.content.ptr = "bar";
  StructSchema::getFieldByName((Field *)&_kjCondition_1,&schema,name_01);
  pcVar1 = (char *)CONCAT44(_kjCondition_1.right,_kjCondition_1.left);
  local_5a8 = _kjCondition_1.op.content.ptr._4_4_;
  uStack_5a0 = CONCAT44(_kjCondition_1._24_4_,_kjCondition_1.op.content.size_._4_4_);
  local_598 = CONCAT44(uStack_8b8,_kjCondition_1._28_4_);
  uStack_590 = CONCAT44(uStack_8b0,uStack_8b4);
  local_588 = (undefined7)CONCAT44(uStack_8a8,local_8ac);
  uStack_580 = (undefined7)CONCAT44(uStack_8a0,uStack_8a4);
  local_578 = local_89c;
  uStack_581 = uVar5;
  uStack_579 = uVar8;
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&root);
  if ((char)_kjCondition.left != '\x01') {
    kj::_::Debug::Fault::Fault
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16e,FAILED,"root.which() != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
  }
  _kjCondition_2.left.ptr.field_1._108_8_ = CONCAT44(uStack_700,uStack_704);
  _kjCondition_2.left.ptr.field_1._116_4_ = local_6fc;
  _kjCondition_2.left.ptr.field_1._0_4_ = (int)_kjCondition_1.op.content.ptr;
  _kjCondition_2.left.ptr.field_1._36_8_ = CONCAT17(uStack_581,local_588);
  _kjCondition_2.left.ptr.field_1._44_8_ = CONCAT17(uStack_579,uStack_580);
  _kjCondition_2.left.ptr.field_1._12_8_ = uStack_5a0;
  _kjCondition_2.left.ptr.field_1._20_8_ = local_598;
  _kjCondition_2.left.ptr.field_1._28_8_ = uStack_590;
  _kjCondition_2.left.ptr.field_1.value.description.content.size_._4_4_ = local_578;
  _kjCondition_2.left.ptr.field_1.value.description.content.disposer =
       (ArrayDisposer *)_kjCondition.op.content.ptr;
  _kjCondition_2.left.ptr.field_1._64_4_ = (int)_kjCondition.op.content.size_;
  _kjCondition_2.left.ptr.field_1.value.trace[2] = anon_var_dwarf_3d166;
  _kjCondition_2.left.ptr.field_1.value.trace[3] = &DAT_00000005;
  _kjCondition_2.left.ptr.field_1._136_1_ =
       (int)_kjCondition_1.op.content.ptr == (int)_kjCondition.op.content.size_ &&
       pcVar1 == _kjCondition.op.content.ptr;
  _kjCondition_2.left.ptr._0_8_ = pcVar1;
  if (((int)_kjCondition_1.op.content.ptr != (int)_kjCondition.op.content.size_ ||
       pcVar1 != _kjCondition.op.content.ptr) && (kj::_::Debug::minSeverity < 3)) {
    name_02.content.size_ = 4;
    name_02.content.ptr = "bar";
    StructSchema::getFieldByName((Field *)&local_418,&schema,name_02);
    DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&_kjCondition_1,&root);
    if ((char)_kjCondition_1.left != '\x01') {
      kj::_::Debug::Fault::Fault
                ((Fault *)&_kjCondition_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x16e,FAILED,"root.which() != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
    }
    uStack_580 = (undefined7)(CONCAT44(local_8ac,uStack_8b0) >> 8);
    local_578 = (undefined4)(CONCAT44(uStack_8a4,uStack_8a8) >> 8);
    _kjCondition.left = CONCAT31(_kjCondition.left._1_3_,1);
    _kjCondition.result = _kjCondition_1.result;
    _kjCondition._25_3_ = _kjCondition_1._25_3_;
    uStack_704 = local_89c;
    uStack_581 = uVar7;
    uStack_579 = uVar10;
    uStack_574 = uVar11;
    kj::_::Debug::
    log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16e,ERROR,
               "\"failed: expected \" \"(schema.getFieldByName(\\\"bar\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 366, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"bar\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 366, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [387])
                "failed: expected (schema.getFieldByName(\"bar\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 366, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                &_kjCondition_2,(Field *)&local_418,(Field *)&_kjCondition.op);
    uStack_700 = uVar3;
    local_6fc = uVar4;
  }
  name_03.content.size_ = 4;
  name_03.content.ptr = "bar";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_2,&root,name_03);
  _kjCondition.right =
       DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                 ((Builder *)&_kjCondition_2);
  _kjCondition.left = 0x141;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_._0_4_ = 5;
  _kjCondition.op.content.size_._4_4_ = 0;
  _kjCondition.result = _kjCondition.right == 0x141;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_2);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_1.left = 0x141;
    name_04.content.size_ = 4;
    name_04.content.ptr = "bar";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_2,&root,name_04);
    local_5a8 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                          ((Builder *)&_kjCondition_2);
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16f,ERROR,
               "\"failed: expected \" \"(321u) == (root.get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.get(\"bar\").as<uint>()"
               ,(char (*) [56])"failed: expected (321u) == (root.get(\"bar\").as<uint>())",
               &_kjCondition,(uint *)&_kjCondition_1,&local_5a8);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_2);
  }
  DynamicStruct::Builder::asReader((Reader *)&_kjCondition,&root);
  name_05.content.size_ = 4;
  name_05.content.ptr = "bar";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_2,(Reader *)&_kjCondition,name_05);
  _kjCondition_1.right =
       DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_2);
  _kjCondition_1.left = 0x141;
  _kjCondition_1.op.content.ptr._0_4_ = 0x4224f8;
  _kjCondition_1.op.content.ptr._4_4_ = 0;
  _kjCondition_1.op.content.size_._0_4_ = 5;
  _kjCondition_1.op.content.size_._4_4_ = 0;
  _kjCondition_1.result = _kjCondition_1.right == 0x141;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_5a8 = 0x141;
    DynamicStruct::Builder::asReader((Reader *)&_kjCondition,&root);
    name_06.content.size_ = 4;
    name_06.content.ptr = "bar";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_2,(Reader *)&_kjCondition,name_06);
    local_418.type =
         DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                   ((Reader *)&_kjCondition_2);
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x170,ERROR,
               "\"failed: expected \" \"(321u) == (root.asReader().get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.asReader().get(\"bar\").as<uint>()"
               ,(char (*) [67])
                "failed: expected (321u) == (root.asReader().get(\"bar\").as<uint>())",
               &_kjCondition_1,&local_5a8,&local_418.type);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
  }
  name_07.content.size_ = 4;
  name_07.content.ptr = "foo";
  DynamicStruct::Builder::get(&local_2f0,&root,name_07);
  DynamicValue::Builder::~Builder(&local_2f0);
  _kjCondition_1.left = _kjCondition_1.left & 0xffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&_kjCondition_1);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition_2,(DebugExpression<kj::Maybe<kj::Exception>> *)&_kjCondition,
             (None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_1);
  if ((_kjCondition_2.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x171,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [85])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"foo\"); }) != kj::none"
               ,&_kjCondition_2);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_2);
  DynamicStruct::Builder::asReader(&local_3d0,&root);
  name_08.content.size_ = 4;
  name_08.content.ptr = "foo";
  DynamicStruct::Reader::get(&local_1f0,&local_3d0,name_08);
  DynamicValue::Reader::~Reader(&local_1f0);
  _kjCondition_1.left = _kjCondition_1.left & 0xffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&_kjCondition_1);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition_2,(DebugExpression<kj::Maybe<kj::Exception>> *)&_kjCondition,
             (None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_1);
  if ((_kjCondition_2.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x172,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [96])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"foo\"); }) != kj::none"
               ,&_kjCondition_2);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_2);
  _kjCondition_2.left.ptr._0_4_ = 3;
  _kjCondition_2.left.ptr.field_1._0_4_ = 0x7b;
  _kjCondition_2.left.ptr.field_1._4_4_ = 0;
  name_34.content.size_ = 4;
  name_34.content.ptr = "foo";
  DynamicStruct::Builder::set(&root,name_34,(Reader *)&_kjCondition_2);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
  name_09.content.size_ = 4;
  name_09.content.ptr = "foo";
  StructSchema::getFieldByName((Field *)&_kjCondition_1,&schema,name_09);
  iVar2 = (int)_kjCondition_1.op.content.ptr;
  pcVar1 = (char *)CONCAT44(_kjCondition_1.right,_kjCondition_1.left);
  local_5a8 = _kjCondition_1.op.content.ptr._4_4_;
  iStack_5a4 = (int)_kjCondition_1.op.content.size_;
  uStack_5a0 = CONCAT44(_kjCondition_1._24_4_,_kjCondition_1.op.content.size_._4_4_);
  local_598 = CONCAT44(uStack_8b8,_kjCondition_1._28_4_);
  uStack_590 = CONCAT44(uStack_8b0,uStack_8b4);
  local_588 = (undefined7)CONCAT44(uStack_8a8,local_8ac);
  uStack_580 = (undefined7)CONCAT44(uStack_8a0,uStack_8a4);
  local_578 = local_89c;
  uStack_581 = uVar5;
  uStack_579 = uVar8;
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&root);
  if ((char)_kjCondition.left != '\x01') {
    kj::_::Debug::Fault::Fault
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x175,FAILED,"root.which() != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
  }
  _kjCondition_2.left.ptr.field_1._68_8_ =
       CONCAT44(_kjCondition._24_4_,_kjCondition.op.content.size_._4_4_);
  _kjCondition_2.left.ptr.field_1._108_8_ = CONCAT44(uStack_700,uStack_704);
  _kjCondition_2.left.ptr.field_1._116_4_ = local_6fc;
  _kjCondition_2.left.ptr.field_1._0_4_ = iVar2;
  _kjCondition_2.left.ptr.field_1._36_8_ = CONCAT17(uStack_581,local_588);
  _kjCondition_2.left.ptr.field_1._44_8_ = CONCAT17(uStack_579,uStack_580);
  _kjCondition_2.left.ptr.field_1._4_4_ = local_5a8;
  _kjCondition_2.left.ptr.field_1.value.ownFile.content.size_._0_4_ = iStack_5a4;
  _kjCondition_2.left.ptr.field_1._12_8_ = uStack_5a0;
  _kjCondition_2.left.ptr.field_1._20_8_ = local_598;
  _kjCondition_2.left.ptr.field_1._28_8_ = uStack_590;
  _kjCondition_2.left.ptr.field_1.value.description.content.size_._4_4_ = local_578;
  _kjCondition_2.left.ptr.field_1.value.description.content.disposer =
       (ArrayDisposer *)_kjCondition.op.content.ptr;
  _kjCondition_2.left.ptr.field_1._64_4_ = (int)_kjCondition.op.content.size_;
  _kjCondition_2.left.ptr.field_1.value.trace[2] = anon_var_dwarf_3d166;
  _kjCondition_2.left.ptr.field_1.value.trace[3] = &DAT_00000005;
  _kjCondition_2.left.ptr.field_1._136_1_ =
       iVar2 == (int)_kjCondition.op.content.size_ && pcVar1 == _kjCondition.op.content.ptr;
  _kjCondition_2.left.ptr._0_8_ = pcVar1;
  if ((iVar2 != (int)_kjCondition.op.content.size_ || pcVar1 != _kjCondition.op.content.ptr) &&
     (kj::_::Debug::minSeverity < 3)) {
    name_10.content.size_ = 4;
    name_10.content.ptr = "foo";
    StructSchema::getFieldByName((Field *)&local_418,&schema,name_10);
    DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&_kjCondition_1,&root);
    if ((char)_kjCondition_1.left != '\x01') {
      kj::_::Debug::Fault::Fault
                ((Fault *)&_kjCondition_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x175,FAILED,"root.which() != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
    }
    _kjCondition.op.content.ptr =
         (char *)CONCAT44(_kjCondition_1.op.content.ptr._4_4_,(int)_kjCondition_1.op.content.ptr);
    uStack_580 = (undefined7)(CONCAT44(local_8ac,uStack_8b0) >> 8);
    local_578 = (undefined4)(CONCAT44(uStack_8a4,uStack_8a8) >> 8);
    _kjCondition.left = CONCAT31(_kjCondition.left._1_3_,1);
    _kjCondition.op.content.size_._0_4_ = (int)_kjCondition_1.op.content.size_;
    _kjCondition.op.content.size_._4_4_ = _kjCondition_1.op.content.size_._4_4_;
    _kjCondition.result = _kjCondition_1.result;
    _kjCondition._25_3_ = _kjCondition_1._25_3_;
    uStack_704 = local_89c;
    uStack_581 = uVar7;
    uStack_579 = uVar10;
    uStack_574 = uVar11;
    kj::_::Debug::
    log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x175,ERROR,
               "\"failed: expected \" \"(schema.getFieldByName(\\\"foo\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 373, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"foo\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 373, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [387])
                "failed: expected (schema.getFieldByName(\"foo\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 373, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                &_kjCondition_2,(Field *)&local_418,(Field *)&_kjCondition.op);
    uStack_700 = uVar3;
    local_6fc = uVar4;
  }
  name_11.content.size_ = 4;
  name_11.content.ptr = "foo";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_2,&root,name_11);
  _kjCondition.right =
       DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                 ((Builder *)&_kjCondition_2);
  _kjCondition.left = 0x7b;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_._0_4_ = 5;
  _kjCondition.op.content.size_._4_4_ = 0;
  _kjCondition.result = _kjCondition.right == 0x7b;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_2);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_1.left = 0x7b;
    name_12.content.size_ = 4;
    name_12.content.ptr = "foo";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_2,&root,name_12);
    local_5a8 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                          ((Builder *)&_kjCondition_2);
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x176,ERROR,
               "\"failed: expected \" \"(123u) == (root.get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.get(\"foo\").as<uint>()"
               ,(char (*) [56])"failed: expected (123u) == (root.get(\"foo\").as<uint>())",
               &_kjCondition,(uint *)&_kjCondition_1,&local_5a8);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_2);
  }
  DynamicStruct::Builder::asReader((Reader *)&_kjCondition,&root);
  name_13.content.size_ = 4;
  name_13.content.ptr = "foo";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_2,(Reader *)&_kjCondition,name_13);
  _kjCondition_1.right =
       DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_2);
  _kjCondition_1.left = 0x7b;
  _kjCondition_1.op.content.ptr._0_4_ = 0x4224f8;
  _kjCondition_1.op.content.ptr._4_4_ = 0;
  _kjCondition_1.op.content.size_._0_4_ = 5;
  _kjCondition_1.op.content.size_._4_4_ = 0;
  _kjCondition_1.result = _kjCondition_1.right == 0x7b;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_5a8 = 0x7b;
    DynamicStruct::Builder::asReader((Reader *)&_kjCondition,&root);
    name_14.content.size_ = 4;
    name_14.content.ptr = "foo";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_2,(Reader *)&_kjCondition,name_14);
    local_418.type =
         DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                   ((Reader *)&_kjCondition_2);
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x177,ERROR,
               "\"failed: expected \" \"(123u) == (root.asReader().get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.asReader().get(\"foo\").as<uint>()"
               ,(char (*) [67])
                "failed: expected (123u) == (root.asReader().get(\"foo\").as<uint>())",
               &_kjCondition_1,&local_5a8,&local_418.type);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
  }
  name_15.content.size_ = 4;
  name_15.content.ptr = "bar";
  DynamicStruct::Builder::get(&local_2b0,&root,name_15);
  DynamicValue::Builder::~Builder(&local_2b0);
  _kjCondition_1.left = _kjCondition_1.left & 0xffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&_kjCondition_1);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition_2,(DebugExpression<kj::Maybe<kj::Exception>> *)&_kjCondition,
             (None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_1);
  if ((_kjCondition_2.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x178,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [85])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"bar\"); }) != kj::none"
               ,&_kjCondition_2);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_2);
  DynamicStruct::Builder::asReader(&local_398,&root);
  name_16.content.size_ = 4;
  name_16.content.ptr = "bar";
  DynamicStruct::Reader::get(&local_1a8,&local_398,name_16);
  DynamicValue::Reader::~Reader(&local_1a8);
  _kjCondition_1.left = _kjCondition_1.left & 0xffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&_kjCondition_1);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition_2,(DebugExpression<kj::Maybe<kj::Exception>> *)&_kjCondition,
             (None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_1);
  if ((_kjCondition_2.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x179,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [96])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"bar\"); }) != kj::none"
               ,&_kjCondition_2);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_2);
  _kjCondition_2.left.ptr._0_4_ = 3;
  _kjCondition_2.left.ptr.field_1._0_4_ = 0x141;
  _kjCondition_2.left.ptr.field_1._4_4_ = 0;
  name_35.content.size_ = 4;
  name_35.content.ptr = "bar";
  DynamicStruct::Builder::set(&root,name_35,(Reader *)&_kjCondition_2);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
  name_17.content.size_ = 4;
  name_17.content.ptr = "bar";
  StructSchema::getFieldByName((Field *)&_kjCondition_1,&schema,name_17);
  iVar2 = (int)_kjCondition_1.op.content.ptr;
  pcVar1 = (char *)CONCAT44(_kjCondition_1.right,_kjCondition_1.left);
  local_5a8 = _kjCondition_1.op.content.ptr._4_4_;
  iStack_5a4 = (int)_kjCondition_1.op.content.size_;
  uStack_5a0 = CONCAT44(_kjCondition_1._24_4_,_kjCondition_1.op.content.size_._4_4_);
  local_598 = CONCAT44(uStack_8b8,_kjCondition_1._28_4_);
  uStack_590 = CONCAT44(uStack_8b0,uStack_8b4);
  local_588 = (undefined7)CONCAT44(uStack_8a8,local_8ac);
  uStack_580 = (undefined7)CONCAT44(uStack_8a0,uStack_8a4);
  local_578 = local_89c;
  uStack_581 = uVar5;
  uStack_579 = uVar8;
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&root);
  if ((char)_kjCondition.left != '\x01') {
    kj::_::Debug::Fault::Fault
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x17c,FAILED,"root.which() != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
  }
  _kjCondition_2.left.ptr.field_1._68_8_ =
       CONCAT44(_kjCondition._24_4_,_kjCondition.op.content.size_._4_4_);
  _kjCondition_2.left.ptr.field_1._108_8_ = CONCAT44(uStack_700,uStack_704);
  _kjCondition_2.left.ptr.field_1._116_4_ = local_6fc;
  _kjCondition_2.left.ptr.field_1._0_4_ = iVar2;
  _kjCondition_2.left.ptr.field_1._36_8_ = CONCAT17(uStack_581,local_588);
  _kjCondition_2.left.ptr.field_1._44_8_ = CONCAT17(uStack_579,uStack_580);
  _kjCondition_2.left.ptr.field_1._4_4_ = local_5a8;
  _kjCondition_2.left.ptr.field_1.value.ownFile.content.size_._0_4_ = iStack_5a4;
  _kjCondition_2.left.ptr.field_1._12_8_ = uStack_5a0;
  _kjCondition_2.left.ptr.field_1._20_8_ = local_598;
  _kjCondition_2.left.ptr.field_1._28_8_ = uStack_590;
  _kjCondition_2.left.ptr.field_1.value.description.content.size_._4_4_ = local_578;
  _kjCondition_2.left.ptr.field_1.value.description.content.disposer =
       (ArrayDisposer *)_kjCondition.op.content.ptr;
  _kjCondition_2.left.ptr.field_1._64_4_ = (int)_kjCondition.op.content.size_;
  _kjCondition_2.left.ptr.field_1.value.trace[2] = anon_var_dwarf_3d166;
  _kjCondition_2.left.ptr.field_1.value.trace[3] = &DAT_00000005;
  _kjCondition_2.left.ptr.field_1._136_1_ =
       iVar2 == (int)_kjCondition.op.content.size_ && pcVar1 == _kjCondition.op.content.ptr;
  _kjCondition_2.left.ptr._0_8_ = pcVar1;
  if ((iVar2 != (int)_kjCondition.op.content.size_ || pcVar1 != _kjCondition.op.content.ptr) &&
     (kj::_::Debug::minSeverity < 3)) {
    name_18.content.size_ = 4;
    name_18.content.ptr = "bar";
    StructSchema::getFieldByName((Field *)&local_418,&schema,name_18);
    DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&_kjCondition_1,&root);
    if ((char)_kjCondition_1.left != '\x01') {
      kj::_::Debug::Fault::Fault
                ((Fault *)&_kjCondition_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x17c,FAILED,"root.which() != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
    }
    _kjCondition.op.content.ptr =
         (char *)CONCAT44(_kjCondition_1.op.content.ptr._4_4_,(int)_kjCondition_1.op.content.ptr);
    uStack_580 = (undefined7)(CONCAT44(local_8ac,uStack_8b0) >> 8);
    local_578 = (undefined4)(CONCAT44(uStack_8a4,uStack_8a8) >> 8);
    _kjCondition.left = CONCAT31(_kjCondition.left._1_3_,1);
    _kjCondition.op.content.size_._0_4_ = (int)_kjCondition_1.op.content.size_;
    _kjCondition.op.content.size_._4_4_ = _kjCondition_1.op.content.size_._4_4_;
    _kjCondition.result = _kjCondition_1.result;
    _kjCondition._25_3_ = _kjCondition_1._25_3_;
    uStack_704 = local_89c;
    uStack_581 = uVar7;
    uStack_579 = uVar10;
    uStack_574 = uVar11;
    kj::_::Debug::
    log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x17c,ERROR,
               "\"failed: expected \" \"(schema.getFieldByName(\\\"bar\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 380, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"bar\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 380, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [387])
                "failed: expected (schema.getFieldByName(\"bar\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 380, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                &_kjCondition_2,(Field *)&local_418,(Field *)&_kjCondition.op);
    uStack_700 = uVar3;
    local_6fc = uVar4;
  }
  name_19.content.size_ = 4;
  name_19.content.ptr = "bar";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_2,&root,name_19);
  _kjCondition.right =
       DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                 ((Builder *)&_kjCondition_2);
  _kjCondition.left = 0x141;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_._0_4_ = 5;
  _kjCondition.op.content.size_._4_4_ = 0;
  _kjCondition.result = _kjCondition.right == 0x141;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_2);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_1.left = 0x141;
    name_20.content.size_ = 4;
    name_20.content.ptr = "bar";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_2,&root,name_20);
    local_5a8 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                          ((Builder *)&_kjCondition_2);
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x17d,ERROR,
               "\"failed: expected \" \"(321u) == (root.get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.get(\"bar\").as<uint>()"
               ,(char (*) [56])"failed: expected (321u) == (root.get(\"bar\").as<uint>())",
               &_kjCondition,(uint *)&_kjCondition_1,&local_5a8);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_2);
  }
  DynamicStruct::Builder::asReader((Reader *)&_kjCondition,&root);
  name_21.content.size_ = 4;
  name_21.content.ptr = "bar";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_2,(Reader *)&_kjCondition,name_21);
  _kjCondition_1.right =
       DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_2);
  _kjCondition_1.left = 0x141;
  _kjCondition_1.op.content.ptr._0_4_ = 0x4224f8;
  _kjCondition_1.op.content.ptr._4_4_ = 0;
  _kjCondition_1.op.content.size_._0_4_ = 5;
  _kjCondition_1.op.content.size_._4_4_ = 0;
  _kjCondition_1.result = _kjCondition_1.right == 0x141;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_5a8 = 0x141;
    DynamicStruct::Builder::asReader((Reader *)&_kjCondition,&root);
    name_22.content.size_ = 4;
    name_22.content.ptr = "bar";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_2,(Reader *)&_kjCondition,name_22);
    local_418.type =
         DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                   ((Reader *)&_kjCondition_2);
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x17e,ERROR,
               "\"failed: expected \" \"(321u) == (root.asReader().get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.asReader().get(\"bar\").as<uint>()"
               ,(char (*) [67])
                "failed: expected (321u) == (root.asReader().get(\"bar\").as<uint>())",
               &_kjCondition_1,&local_5a8,&local_418.type);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
  }
  name_23.content.size_ = 4;
  name_23.content.ptr = "foo";
  DynamicStruct::Builder::get(&local_270,&root,name_23);
  DynamicValue::Builder::~Builder(&local_270);
  _kjCondition_1.left = _kjCondition_1.left & 0xffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&_kjCondition_1);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition_2,(DebugExpression<kj::Maybe<kj::Exception>> *)&_kjCondition,
             (None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_1);
  if ((_kjCondition_2.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x17f,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [85])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"foo\"); }) != kj::none"
               ,&_kjCondition_2);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_2);
  DynamicStruct::Builder::asReader(&local_360,&root);
  name_24.content.size_ = 4;
  name_24.content.ptr = "foo";
  DynamicStruct::Reader::get(&local_160,&local_360,name_24);
  DynamicValue::Reader::~Reader(&local_160);
  _kjCondition_1.left = _kjCondition_1.left & 0xffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&_kjCondition_1);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition_2,(DebugExpression<kj::Maybe<kj::Exception>> *)&_kjCondition,
             (None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_1);
  if ((_kjCondition_2.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x180,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [96])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"foo\"); }) != kj::none"
               ,&_kjCondition_2);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_2);
  _kjCondition_2.left.ptr._0_4_ = 3;
  _kjCondition_2.left.ptr.field_1._0_4_ = 0x7b;
  _kjCondition_2.left.ptr.field_1._4_4_ = 0;
  name_36.content.size_ = 4;
  name_36.content.ptr = "foo";
  DynamicStruct::Builder::set(&root,name_36,(Reader *)&_kjCondition_2);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
  name_25.content.size_ = 4;
  name_25.content.ptr = "foo";
  StructSchema::getFieldByName((Field *)&_kjCondition_1,&schema,name_25);
  iVar2 = (int)_kjCondition_1.op.content.ptr;
  pcVar1 = (char *)CONCAT44(_kjCondition_1.right,_kjCondition_1.left);
  local_5a8 = _kjCondition_1.op.content.ptr._4_4_;
  iStack_5a4 = (int)_kjCondition_1.op.content.size_;
  uStack_5a0 = CONCAT44(_kjCondition_1._24_4_,_kjCondition_1.op.content.size_._4_4_);
  local_598 = CONCAT44(uStack_8b8,_kjCondition_1._28_4_);
  uStack_590 = CONCAT44(uStack_8b0,uStack_8b4);
  local_588 = (undefined7)CONCAT44(uStack_8a8,local_8ac);
  uStack_580 = (undefined7)CONCAT44(uStack_8a0,uStack_8a4);
  local_578 = local_89c;
  uStack_581 = uVar5;
  uStack_579 = uVar8;
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&root);
  if ((char)_kjCondition.left == '\x01') {
    _kjCondition_2.left.ptr.field_1._68_8_ =
         CONCAT44(_kjCondition._24_4_,_kjCondition.op.content.size_._4_4_);
    _kjCondition_2.left.ptr.field_1._108_8_ = CONCAT44(uStack_700,uStack_704);
    _kjCondition_2.left.ptr.field_1._116_4_ = local_6fc;
    _kjCondition_2.left.ptr.field_1._0_4_ = iVar2;
    _kjCondition_2.left.ptr.field_1._36_8_ = CONCAT17(uStack_581,local_588);
    _kjCondition_2.left.ptr.field_1._44_8_ = CONCAT17(uStack_579,uStack_580);
    _kjCondition_2.left.ptr.field_1._4_4_ = local_5a8;
    _kjCondition_2.left.ptr.field_1.value.ownFile.content.size_._0_4_ = iStack_5a4;
    _kjCondition_2.left.ptr.field_1._12_8_ = uStack_5a0;
    _kjCondition_2.left.ptr.field_1._20_8_ = local_598;
    _kjCondition_2.left.ptr.field_1._28_8_ = uStack_590;
    _kjCondition_2.left.ptr.field_1.value.description.content.size_._4_4_ = local_578;
    _kjCondition_2.left.ptr.field_1.value.description.content.disposer =
         (ArrayDisposer *)_kjCondition.op.content.ptr;
    _kjCondition_2.left.ptr.field_1._64_4_ = (int)_kjCondition.op.content.size_;
    _kjCondition_2.left.ptr.field_1.value.trace[2] = anon_var_dwarf_3d166;
    _kjCondition_2.left.ptr.field_1.value.trace[3] = &DAT_00000005;
    _kjCondition_2.left.ptr.field_1._136_1_ =
         iVar2 == (int)_kjCondition.op.content.size_ && pcVar1 == _kjCondition.op.content.ptr;
    _kjCondition_2.left.ptr._0_8_ = pcVar1;
    if ((iVar2 != (int)_kjCondition.op.content.size_ || pcVar1 != _kjCondition.op.content.ptr) &&
       (kj::_::Debug::minSeverity < 3)) {
      name_26.content.size_ = 4;
      name_26.content.ptr = "foo";
      StructSchema::getFieldByName((Field *)&local_418,&schema,name_26);
      DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)&_kjCondition_1,&root);
      if ((char)_kjCondition_1.left != '\x01') {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&_kjCondition_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x183,FAILED,"root.which() != nullptr","");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
      }
      _kjCondition.op.content.ptr =
           (char *)CONCAT44(_kjCondition_1.op.content.ptr._4_4_,(int)_kjCondition_1.op.content.ptr);
      uStack_580 = (undefined7)(CONCAT44(local_8ac,uStack_8b0) >> 8);
      local_578 = (undefined4)(CONCAT44(uStack_8a4,uStack_8a8) >> 8);
      _kjCondition.left = CONCAT31(_kjCondition.left._1_3_,1);
      _kjCondition.op.content.size_._0_4_ = (int)_kjCondition_1.op.content.size_;
      _kjCondition.op.content.size_._4_4_ = _kjCondition_1.op.content.size_._4_4_;
      _kjCondition.result = _kjCondition_1.result;
      _kjCondition._25_3_ = _kjCondition_1._25_3_;
      uStack_581 = uVar7;
      uStack_579 = uVar10;
      uStack_574 = uVar11;
      kj::_::Debug::
      log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x183,ERROR,
                 "\"failed: expected \" \"(schema.getFieldByName(\\\"foo\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 387, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"foo\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 387, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [387])
                  "failed: expected (schema.getFieldByName(\"foo\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 387, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                  &_kjCondition_2,(Field *)&local_418,(Field *)&_kjCondition.op);
    }
    name_27.content.size_ = 4;
    name_27.content.ptr = "foo";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_2,&root,name_27);
    _kjCondition.right =
         DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                   ((Builder *)&_kjCondition_2);
    _kjCondition.left = 0x7b;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_._0_4_ = 5;
    _kjCondition.op.content.size_._4_4_ = 0;
    _kjCondition.result = _kjCondition.right == 0x7b;
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_2);
    if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
      _kjCondition_1.left = 0x7b;
      name_28.content.size_ = 4;
      name_28.content.ptr = "foo";
      DynamicStruct::Builder::get((Builder *)&_kjCondition_2,&root,name_28);
      local_5a8 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                            ((Builder *)&_kjCondition_2);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x184,ERROR,
                 "\"failed: expected \" \"(123u) == (root.get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.get(\"foo\").as<uint>()"
                 ,(char (*) [56])"failed: expected (123u) == (root.get(\"foo\").as<uint>())",
                 &_kjCondition,(uint *)&_kjCondition_1,&local_5a8);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_2);
    }
    DynamicStruct::Builder::asReader((Reader *)&_kjCondition,&root);
    name_29.content.size_ = 4;
    name_29.content.ptr = "foo";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_2,(Reader *)&_kjCondition,name_29);
    _kjCondition_1.right =
         DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                   ((Reader *)&_kjCondition_2);
    _kjCondition_1.left = 0x7b;
    _kjCondition_1.op.content.ptr._0_4_ = 0x4224f8;
    _kjCondition_1.op.content.ptr._4_4_ = 0;
    _kjCondition_1.op.content.size_._0_4_ = 5;
    _kjCondition_1.op.content.size_._4_4_ = 0;
    _kjCondition_1.result = _kjCondition_1.right == 0x7b;
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
    if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
      local_5a8 = 0x7b;
      DynamicStruct::Builder::asReader((Reader *)&_kjCondition,&root);
      name_30.content.size_ = 4;
      name_30.content.ptr = "foo";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_2,(Reader *)&_kjCondition,name_30);
      local_418.type =
           DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                     ((Reader *)&_kjCondition_2);
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x185,ERROR,
                 "\"failed: expected \" \"(123u) == (root.asReader().get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.asReader().get(\"foo\").as<uint>()"
                 ,(char (*) [67])
                  "failed: expected (123u) == (root.asReader().get(\"foo\").as<uint>())",
                 &_kjCondition_1,&local_5a8,&local_418.type);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_2);
    }
    name_31.content.size_ = 4;
    name_31.content.ptr = "bar";
    DynamicStruct::Builder::get(&local_230,&root,name_31);
    DynamicValue::Builder::~Builder(&local_230);
    _kjCondition_1.left = _kjCondition_1.left & 0xffffff00;
    kj::Maybe<kj::Exception>::Maybe
              ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&_kjCondition_1);
    kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
              (&_kjCondition_2,(DebugExpression<kj::Maybe<kj::Exception>> *)&_kjCondition,
               (None *)&kj::none);
    kj::_::NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)&_kjCondition);
    kj::_::NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)&_kjCondition_1);
    if ((_kjCondition_2.result == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x186,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"bar\"); }) != kj::none"
                 ,&_kjCondition_2);
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)&_kjCondition_2);
    DynamicStruct::Builder::asReader(&local_328,&root);
    name_32.content.size_ = 4;
    name_32.content.ptr = "bar";
    DynamicStruct::Reader::get(&local_418,&local_328,name_32);
    DynamicValue::Reader::~Reader(&local_418);
    _kjCondition_1.left = _kjCondition_1.left & 0xffffff00;
    kj::Maybe<kj::Exception>::Maybe
              ((Maybe<kj::Exception> *)&_kjCondition,(Maybe<kj::Exception> *)&_kjCondition_1);
    kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
              (&_kjCondition_2,(DebugExpression<kj::Maybe<kj::Exception>> *)&_kjCondition,
               (None *)&kj::none);
    kj::_::NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)&_kjCondition);
    kj::_::NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)&_kjCondition_1);
    if ((_kjCondition_2.result == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x187,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [96])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"bar\"); }) != kj::none"
                 ,&_kjCondition_2);
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)&_kjCondition_2);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)&_kjCondition,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0x183,FAILED,"root.which() != nullptr","");
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
}

Assistant:

TEST(DynamicApi, UnnamedUnion) {
  MallocMessageBuilder builder;
  StructSchema schema = Schema::from<test::TestUnnamedUnion>();
  auto root = builder.initRoot<DynamicStruct>(schema);

  EXPECT_EQ(schema.getFieldByName("foo"), KJ_ASSERT_NONNULL(root.which()));

  root.set("bar", 321);
  EXPECT_EQ(schema.getFieldByName("bar"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(321u, root.get("bar").as<uint>());
  EXPECT_EQ(321u, root.asReader().get("bar").as<uint>());
  EXPECT_ANY_THROW(root.get("foo"));
  EXPECT_ANY_THROW(root.asReader().get("foo"));

  root.set("foo", 123);
  EXPECT_EQ(schema.getFieldByName("foo"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(123u, root.get("foo").as<uint>());
  EXPECT_EQ(123u, root.asReader().get("foo").as<uint>());
  EXPECT_ANY_THROW(root.get("bar"));
  EXPECT_ANY_THROW(root.asReader().get("bar"));

  root.set("bar", 321);
  EXPECT_EQ(schema.getFieldByName("bar"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(321u, root.get("bar").as<uint>());
  EXPECT_EQ(321u, root.asReader().get("bar").as<uint>());
  EXPECT_ANY_THROW(root.get("foo"));
  EXPECT_ANY_THROW(root.asReader().get("foo"));

  root.set("foo", 123);
  EXPECT_EQ(schema.getFieldByName("foo"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(123u, root.get("foo").as<uint>());
  EXPECT_EQ(123u, root.asReader().get("foo").as<uint>());
  EXPECT_ANY_THROW(root.get("bar"));
  EXPECT_ANY_THROW(root.asReader().get("bar"));
}